

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O0

int CmdCommandAlias(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Alias *pAStack_38;
  int c;
  char *value;
  char *key;
  char **argv_local;
  Abc_Frame_t *pAStack_18;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  key = (char *)argv;
  argv_local._4_4_ = argc;
  pAStack_18 = pAbc;
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argv_local._4_4_,(char **)key,"h");
  if (iVar1 == -1) {
    if (argv_local._4_4_ == 1) {
      CmdPrintTable(pAStack_18->tAliases,1);
      pAbc_local._4_4_ = 0;
    }
    else if (argv_local._4_4_ == 2) {
      iVar1 = st__lookup(pAStack_18->tAliases,*(char **)(key + 8),(char **)&stack0xffffffffffffffc8)
      ;
      if (iVar1 != 0) {
        CmdCommandAliasPrint(pAStack_18,pAStack_38);
      }
      pAbc_local._4_4_ = 0;
    }
    else {
      value = *(char **)(key + 8);
      iVar1 = st__delete(pAStack_18->tAliases,&value,(char **)&stack0xffffffffffffffc8);
      if (iVar1 != 0) {
        CmdCommandAliasFree(pAStack_38);
      }
      CmdCommandAliasAdd(pAStack_18,*(char **)(key + 8),argv_local._4_4_ + -2,(char **)(key + 0x10))
      ;
      pAbc_local._4_4_ = 0;
    }
  }
  else {
    fprintf((FILE *)pAStack_18->Err,"usage: alias [-h] [command [string]]\n");
    fprintf((FILE *)pAStack_18->Err,"   -h \t\tprint the command usage\n");
    pAbc_local._4_4_ = 1;
  }
  return pAbc_local._4_4_;
}

Assistant:

int CmdCommandAlias( Abc_Frame_t * pAbc, int argc, char **argv )
{
    const char *key;
    char *value;
    int c;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
        case 'h':
            goto usage;
            break;
        default:
            goto usage;
        }
    }


    if ( argc == 1 )
    {
        CmdPrintTable( pAbc->tAliases, 1 );
        return 0;

    }
    else if ( argc == 2 )
    {
        if ( st__lookup( pAbc->tAliases, argv[1], &value ) )
            CmdCommandAliasPrint( pAbc, ( Abc_Alias * ) value );
        return 0;
    }

    // delete any existing alias
    key = argv[1];
    if ( st__delete( pAbc->tAliases, &key, &value ) )
        CmdCommandAliasFree( ( Abc_Alias * ) value );
    CmdCommandAliasAdd( pAbc, argv[1], argc - 2, argv + 2 );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: alias [-h] [command [string]]\n" );
    fprintf( pAbc->Err, "   -h \t\tprint the command usage\n" );
    return ( 1 );
}